

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Set_data(int g_a,int ndim,int *dims,int type)

{
  ulong uVar1;
  Integer _ga_dims [7];
  Integer aIStack_38 [7];
  
  if (0 < ndim) {
    uVar1 = (ulong)(uint)ndim;
    do {
      aIStack_38[uVar1 - 1] = (long)*dims;
      dims = dims + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  pnga_set_data((long)g_a,(long)ndim,aIStack_38,(long)type);
  return;
}

Assistant:

void NGA_Set_data(int g_a, int ndim, int dims[], int type)
{
    Integer aa, nndim, ttype;
    Integer _ga_dims[MAXDIM];
    COPYC2F(dims,_ga_dims, ndim);
    aa = (Integer)g_a;
    nndim = (Integer)ndim;
    ttype = (Integer)type;
    wnga_set_data(aa, nndim, _ga_dims, ttype);
}